

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmd128.c
# Opt level: O0

int rmd128_compress(hash_state *md,uchar *buf)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long in_RSI;
  long in_RDI;
  ulong32 __ROLc_tmp_113;
  ulong32 __ROLc_tmp_112;
  ulong32 __ROLc_tmp_111;
  ulong32 __ROLc_tmp_110;
  ulong32 __ROLc_tmp_109;
  ulong32 __ROLc_tmp_108;
  ulong32 __ROLc_tmp_107;
  ulong32 __ROLc_tmp_106;
  ulong32 __ROLc_tmp_105;
  ulong32 __ROLc_tmp_104;
  ulong32 __ROLc_tmp_103;
  ulong32 __ROLc_tmp_102;
  ulong32 __ROLc_tmp_101;
  ulong32 __ROLc_tmp_100;
  ulong32 __ROLc_tmp_99;
  ulong32 __ROLc_tmp_98;
  ulong32 __ROLc_tmp_97;
  ulong32 __ROLc_tmp_96;
  ulong32 __ROLc_tmp_95;
  ulong32 __ROLc_tmp_94;
  ulong32 __ROLc_tmp_93;
  ulong32 __ROLc_tmp_92;
  ulong32 __ROLc_tmp_91;
  ulong32 __ROLc_tmp_90;
  ulong32 __ROLc_tmp_89;
  ulong32 __ROLc_tmp_88;
  ulong32 __ROLc_tmp_87;
  ulong32 __ROLc_tmp_86;
  ulong32 __ROLc_tmp_85;
  ulong32 __ROLc_tmp_84;
  ulong32 __ROLc_tmp_83;
  ulong32 __ROLc_tmp_82;
  ulong32 __ROLc_tmp_81;
  ulong32 __ROLc_tmp_80;
  ulong32 __ROLc_tmp_79;
  ulong32 __ROLc_tmp_78;
  ulong32 __ROLc_tmp_77;
  ulong32 __ROLc_tmp_76;
  ulong32 __ROLc_tmp_75;
  ulong32 __ROLc_tmp_74;
  ulong32 __ROLc_tmp_73;
  ulong32 __ROLc_tmp_72;
  ulong32 __ROLc_tmp_71;
  ulong32 __ROLc_tmp_70;
  ulong32 __ROLc_tmp_69;
  ulong32 __ROLc_tmp_68;
  ulong32 __ROLc_tmp_67;
  ulong32 __ROLc_tmp_66;
  ulong32 __ROLc_tmp_65;
  ulong32 __ROLc_tmp_64;
  ulong32 __ROLc_tmp_63;
  ulong32 __ROLc_tmp_62;
  ulong32 __ROLc_tmp_61;
  ulong32 __ROLc_tmp_60;
  ulong32 __ROLc_tmp_59;
  ulong32 __ROLc_tmp_58;
  ulong32 __ROLc_tmp_57;
  ulong32 __ROLc_tmp_56;
  ulong32 __ROLc_tmp_55;
  ulong32 __ROLc_tmp_54;
  ulong32 __ROLc_tmp_53;
  ulong32 __ROLc_tmp_52;
  ulong32 __ROLc_tmp_51;
  ulong32 __ROLc_tmp_50;
  ulong32 __ROLc_tmp_49;
  ulong32 __ROLc_tmp_48;
  ulong32 __ROLc_tmp_47;
  ulong32 __ROLc_tmp_46;
  ulong32 __ROLc_tmp_45;
  ulong32 __ROLc_tmp_44;
  ulong32 __ROLc_tmp_43;
  ulong32 __ROLc_tmp_42;
  ulong32 __ROLc_tmp_41;
  ulong32 __ROLc_tmp_40;
  ulong32 __ROLc_tmp_39;
  ulong32 __ROLc_tmp_38;
  ulong32 __ROLc_tmp_37;
  ulong32 __ROLc_tmp_36;
  ulong32 __ROLc_tmp_35;
  ulong32 __ROLc_tmp_34;
  ulong32 __ROLc_tmp_33;
  ulong32 __ROLc_tmp_32;
  ulong32 __ROLc_tmp_31;
  ulong32 __ROLc_tmp_30;
  ulong32 __ROLc_tmp_29;
  ulong32 __ROLc_tmp_28;
  ulong32 __ROLc_tmp_27;
  ulong32 __ROLc_tmp_26;
  ulong32 __ROLc_tmp_25;
  ulong32 __ROLc_tmp_24;
  ulong32 __ROLc_tmp_23;
  ulong32 __ROLc_tmp_22;
  ulong32 __ROLc_tmp_21;
  ulong32 __ROLc_tmp_20;
  ulong32 __ROLc_tmp_19;
  ulong32 __ROLc_tmp_18;
  ulong32 __ROLc_tmp_17;
  ulong32 __ROLc_tmp_16;
  ulong32 __ROLc_tmp_15;
  ulong32 __ROLc_tmp_14;
  ulong32 __ROLc_tmp_13;
  ulong32 __ROLc_tmp_12;
  ulong32 __ROLc_tmp_11;
  ulong32 __ROLc_tmp_10;
  ulong32 __ROLc_tmp_9;
  ulong32 __ROLc_tmp_8;
  ulong32 __ROLc_tmp_7;
  ulong32 __ROLc_tmp_6;
  ulong32 __ROLc_tmp_5;
  ulong32 __ROLc_tmp_4;
  ulong32 __ROLc_tmp_3;
  ulong32 __ROLc_tmp_2;
  ulong32 __ROLc_tmp_1;
  ulong32 __ROLc_tmp;
  int i;
  ulong32 X [16];
  ulong32 ddd;
  ulong32 ccc;
  ulong32 bbb;
  ulong32 aaa;
  ulong32 dd;
  ulong32 cc;
  ulong32 bb;
  ulong32 aa;
  int local_7c;
  ulong32 local_78 [2];
  ulong32 __ROLc_tmp_127;
  int local_6c;
  ulong32 __ROLc_tmp_126;
  int local_64;
  ulong32 __ROLc_tmp_125;
  int local_5c;
  ulong32 __ROLc_tmp_124;
  int local_54;
  ulong32 __ROLc_tmp_123;
  int local_4c;
  ulong32 __ROLc_tmp_122;
  int local_44;
  ulong32 __ROLc_tmp_121;
  int local_3c;
  ulong32 __ROLc_tmp_120;
  ulong32 __ROLc_tmp_119;
  ulong32 __ROLc_tmp_118;
  ulong32 __ROLc_tmp_117;
  ulong32 __ROLc_tmp_116;
  ulong32 __ROLc_tmp_115;
  ulong32 __ROLc_tmp_114;
  
  for (local_7c = 0; local_7c < 0x10; local_7c = local_7c + 1) {
    local_78[local_7c] = *(ulong32 *)(in_RSI + (local_7c << 2));
    local_78[local_7c] = local_78[local_7c];
  }
  uVar9 = *(uint *)(in_RDI + 0x50);
  uVar8 = *(uint *)(in_RDI + 0x54);
  uVar7 = *(uint *)(in_RDI + 0x58);
  uVar2 = (uVar9 ^ uVar8 ^ uVar7) + local_78[0] + *(int *)(in_RDI + 0x4c);
  uVar3 = uVar2 * 0x800 | uVar2 >> 0x15;
  uVar2 = (uVar3 ^ uVar9 ^ uVar8) + local_78[1] + uVar7;
  uVar4 = uVar2 * 0x4000 | uVar2 >> 0x12;
  uVar2 = (uVar4 ^ uVar3 ^ uVar9) + __ROLc_tmp_127 + uVar8;
  uVar5 = uVar2 * 0x8000 | uVar2 >> 0x11;
  uVar2 = (uVar5 ^ uVar4 ^ uVar3) + local_6c + uVar9;
  uVar2 = uVar2 * 0x1000 | uVar2 >> 0x14;
  uVar3 = (uVar2 ^ uVar5 ^ uVar4) + __ROLc_tmp_126 + uVar3;
  uVar3 = uVar3 * 0x20 | uVar3 >> 0x1b;
  uVar4 = (uVar3 ^ uVar2 ^ uVar5) + local_64 + uVar4;
  uVar4 = uVar4 * 0x100 | uVar4 >> 0x18;
  uVar5 = (uVar4 ^ uVar3 ^ uVar2) + __ROLc_tmp_125 + uVar5;
  uVar5 = uVar5 * 0x80 | uVar5 >> 0x19;
  uVar2 = (uVar5 ^ uVar4 ^ uVar3) + local_5c + uVar2;
  uVar2 = uVar2 * 0x200 | uVar2 >> 0x17;
  uVar3 = (uVar2 ^ uVar5 ^ uVar4) + __ROLc_tmp_124 + uVar3;
  uVar3 = uVar3 * 0x800 | uVar3 >> 0x15;
  uVar4 = (uVar3 ^ uVar2 ^ uVar5) + local_54 + uVar4;
  uVar4 = uVar4 * 0x2000 | uVar4 >> 0x13;
  uVar5 = (uVar4 ^ uVar3 ^ uVar2) + __ROLc_tmp_123 + uVar5;
  uVar5 = uVar5 * 0x4000 | uVar5 >> 0x12;
  uVar2 = (uVar5 ^ uVar4 ^ uVar3) + local_4c + uVar2;
  uVar2 = uVar2 * 0x8000 | uVar2 >> 0x11;
  uVar3 = (uVar2 ^ uVar5 ^ uVar4) + __ROLc_tmp_122 + uVar3;
  uVar3 = uVar3 * 0x40 | uVar3 >> 0x1a;
  uVar4 = (uVar3 ^ uVar2 ^ uVar5) + local_44 + uVar4;
  uVar4 = uVar4 * 0x80 | uVar4 >> 0x19;
  uVar5 = (uVar4 ^ uVar3 ^ uVar2) + __ROLc_tmp_121 + uVar5;
  uVar5 = uVar5 * 0x200 | uVar5 >> 0x17;
  uVar2 = (uVar5 ^ uVar4 ^ uVar3) + local_3c + uVar2;
  uVar2 = uVar2 * 0x100 | uVar2 >> 0x18;
  uVar3 = uVar3 + (uVar2 & uVar5 | (uVar2 ^ 0xffffffff) & uVar4) + local_5c + 0x5a827999;
  uVar3 = uVar3 * 0x80 | uVar3 >> 0x19;
  uVar4 = uVar4 + (uVar3 & uVar2 | (uVar3 ^ 0xffffffff) & uVar5) + __ROLc_tmp_126 + 0x5a827999;
  uVar4 = uVar4 * 0x40 | uVar4 >> 0x1a;
  uVar5 = uVar5 + (uVar4 & uVar3 | (uVar4 ^ 0xffffffff) & uVar2) + local_44 + 0x5a827999;
  uVar5 = uVar5 * 0x100 | uVar5 >> 0x18;
  uVar2 = uVar2 + (uVar5 & uVar4 | (uVar5 ^ 0xffffffff) & uVar3) + local_78[1] + 0x5a827999;
  uVar2 = uVar2 * 0x2000 | uVar2 >> 0x13;
  uVar3 = uVar3 + (uVar2 & uVar5 | (uVar2 ^ 0xffffffff) & uVar4) + __ROLc_tmp_123 + 0x5a827999;
  uVar3 = uVar3 * 0x800 | uVar3 >> 0x15;
  uVar4 = uVar4 + (uVar3 & uVar2 | (uVar3 ^ 0xffffffff) & uVar5) + __ROLc_tmp_125 + 0x5a827999;
  uVar4 = uVar4 * 0x200 | uVar4 >> 0x17;
  uVar5 = uVar5 + (uVar4 & uVar3 | (uVar4 ^ 0xffffffff) & uVar2) + local_3c + 0x5a827999;
  uVar5 = uVar5 * 0x80 | uVar5 >> 0x19;
  uVar2 = uVar2 + (uVar5 & uVar4 | (uVar5 ^ 0xffffffff) & uVar3) + local_6c + 0x5a827999;
  uVar2 = uVar2 * 0x8000 | uVar2 >> 0x11;
  uVar3 = uVar3 + (uVar2 & uVar5 | (uVar2 ^ 0xffffffff) & uVar4) + __ROLc_tmp_122 + 0x5a827999;
  uVar3 = uVar3 * 0x80 | uVar3 >> 0x19;
  uVar4 = uVar4 + (uVar3 & uVar2 | (uVar3 ^ 0xffffffff) & uVar5) + local_78[0] + 0x5a827999;
  uVar4 = uVar4 * 0x1000 | uVar4 >> 0x14;
  uVar5 = uVar5 + (uVar4 & uVar3 | (uVar4 ^ 0xffffffff) & uVar2) + local_54 + 0x5a827999;
  uVar5 = uVar5 * 0x8000 | uVar5 >> 0x11;
  uVar2 = uVar2 + (uVar5 & uVar4 | (uVar5 ^ 0xffffffff) & uVar3) + local_64 + 0x5a827999;
  uVar2 = uVar2 * 0x200 | uVar2 >> 0x17;
  uVar3 = uVar3 + (uVar2 & uVar5 | (uVar2 ^ 0xffffffff) & uVar4) + __ROLc_tmp_127 + 0x5a827999;
  uVar3 = uVar3 * 0x800 | uVar3 >> 0x15;
  uVar4 = uVar4 + (uVar3 & uVar2 | (uVar3 ^ 0xffffffff) & uVar5) + __ROLc_tmp_121 + 0x5a827999;
  uVar4 = uVar4 * 0x80 | uVar4 >> 0x19;
  uVar5 = uVar5 + (uVar4 & uVar3 | (uVar4 ^ 0xffffffff) & uVar2) + local_4c + 0x5a827999;
  uVar5 = uVar5 * 0x2000 | uVar5 >> 0x13;
  uVar2 = uVar2 + (uVar5 & uVar4 | (uVar5 ^ 0xffffffff) & uVar3) + __ROLc_tmp_124 + 0x5a827999;
  uVar2 = uVar2 * 0x1000 | uVar2 >> 0x14;
  uVar3 = uVar3 + ((uVar2 | uVar5 ^ 0xffffffff) ^ uVar4) + local_6c + 0x6ed9eba1;
  uVar3 = uVar3 * 0x800 | uVar3 >> 0x15;
  uVar4 = uVar4 + ((uVar3 | uVar2 ^ 0xffffffff) ^ uVar5) + __ROLc_tmp_123 + 0x6ed9eba1;
  uVar4 = uVar4 * 0x2000 | uVar4 >> 0x13;
  uVar5 = uVar5 + ((uVar4 | uVar3 ^ 0xffffffff) ^ uVar2) + __ROLc_tmp_121 + 0x6ed9eba1;
  uVar5 = uVar5 * 0x40 | uVar5 >> 0x1a;
  uVar2 = uVar2 + ((uVar5 | uVar4 ^ 0xffffffff) ^ uVar3) + __ROLc_tmp_126 + 0x6ed9eba1;
  uVar2 = uVar2 * 0x80 | uVar2 >> 0x19;
  uVar3 = uVar3 + ((uVar2 | uVar5 ^ 0xffffffff) ^ uVar4) + local_54 + 0x6ed9eba1;
  uVar3 = uVar3 * 0x4000 | uVar3 >> 0x12;
  uVar4 = uVar4 + ((uVar3 | uVar2 ^ 0xffffffff) ^ uVar5) + local_3c + 0x6ed9eba1;
  uVar4 = uVar4 * 0x200 | uVar4 >> 0x17;
  uVar5 = uVar5 + ((uVar4 | uVar3 ^ 0xffffffff) ^ uVar2) + __ROLc_tmp_124 + 0x6ed9eba1;
  uVar5 = uVar5 * 0x2000 | uVar5 >> 0x13;
  uVar2 = uVar2 + ((uVar5 | uVar4 ^ 0xffffffff) ^ uVar3) + local_78[1] + 0x6ed9eba1;
  uVar2 = uVar2 * 0x8000 | uVar2 >> 0x11;
  uVar3 = uVar3 + ((uVar2 | uVar5 ^ 0xffffffff) ^ uVar4) + __ROLc_tmp_127 + 0x6ed9eba1;
  uVar3 = uVar3 * 0x4000 | uVar3 >> 0x12;
  uVar4 = uVar4 + ((uVar3 | uVar2 ^ 0xffffffff) ^ uVar5) + local_5c + 0x6ed9eba1;
  uVar4 = uVar4 * 0x100 | uVar4 >> 0x18;
  uVar5 = uVar5 + ((uVar4 | uVar3 ^ 0xffffffff) ^ uVar2) + local_78[0] + 0x6ed9eba1;
  uVar5 = uVar5 * 0x2000 | uVar5 >> 0x13;
  uVar2 = uVar2 + ((uVar5 | uVar4 ^ 0xffffffff) ^ uVar3) + __ROLc_tmp_125 + 0x6ed9eba1;
  uVar2 = uVar2 * 0x40 | uVar2 >> 0x1a;
  uVar3 = uVar3 + ((uVar2 | uVar5 ^ 0xffffffff) ^ uVar4) + local_44 + 0x6ed9eba1;
  uVar3 = uVar3 * 0x20 | uVar3 >> 0x1b;
  uVar4 = uVar4 + ((uVar3 | uVar2 ^ 0xffffffff) ^ uVar5) + local_4c + 0x6ed9eba1;
  uVar4 = uVar4 * 0x1000 | uVar4 >> 0x14;
  uVar5 = uVar5 + ((uVar4 | uVar3 ^ 0xffffffff) ^ uVar2) + local_64 + 0x6ed9eba1;
  uVar5 = uVar5 * 0x80 | uVar5 >> 0x19;
  uVar2 = uVar2 + ((uVar5 | uVar4 ^ 0xffffffff) ^ uVar3) + __ROLc_tmp_122 + 0x6ed9eba1;
  uVar2 = uVar2 * 0x20 | uVar2 >> 0x1b;
  uVar3 = uVar3 + (uVar2 & uVar4 | uVar5 & (uVar4 ^ 0xffffffff)) + local_78[1] + -0x70e44324;
  uVar3 = uVar3 * 0x800 | uVar3 >> 0x15;
  uVar4 = uVar4 + (uVar3 & uVar5 | uVar2 & (uVar5 ^ 0xffffffff)) + local_54 + -0x70e44324;
  uVar4 = uVar4 * 0x1000 | uVar4 >> 0x14;
  uVar5 = uVar5 + (uVar4 & uVar2 | uVar3 & (uVar2 ^ 0xffffffff)) + local_4c + -0x70e44324;
  uVar5 = uVar5 * 0x4000 | uVar5 >> 0x12;
  uVar2 = uVar2 + (uVar5 & uVar3 | uVar4 & (uVar3 ^ 0xffffffff)) + __ROLc_tmp_123 + -0x70e44324;
  uVar2 = uVar2 * 0x8000 | uVar2 >> 0x11;
  uVar3 = uVar3 + (uVar2 & uVar4 | uVar5 & (uVar4 ^ 0xffffffff)) + local_78[0] + -0x70e44324;
  uVar3 = uVar3 * 0x4000 | uVar3 >> 0x12;
  uVar4 = uVar4 + (uVar3 & uVar5 | uVar2 & (uVar5 ^ 0xffffffff)) + __ROLc_tmp_124 + -0x70e44324;
  uVar4 = uVar4 * 0x8000 | uVar4 >> 0x11;
  uVar5 = uVar5 + (uVar4 & uVar2 | uVar3 & (uVar2 ^ 0xffffffff)) + __ROLc_tmp_122 + -0x70e44324;
  uVar5 = uVar5 * 0x200 | uVar5 >> 0x17;
  uVar2 = uVar2 + (uVar5 & uVar3 | uVar4 & (uVar3 ^ 0xffffffff)) + __ROLc_tmp_126 + -0x70e44324;
  uVar2 = uVar2 * 0x100 | uVar2 >> 0x18;
  uVar3 = uVar3 + (uVar2 & uVar4 | uVar5 & (uVar4 ^ 0xffffffff)) + local_44 + -0x70e44324;
  uVar3 = uVar3 * 0x200 | uVar3 >> 0x17;
  uVar4 = uVar4 + (uVar3 & uVar5 | uVar2 & (uVar5 ^ 0xffffffff)) + local_6c + -0x70e44324;
  uVar4 = uVar4 * 0x4000 | uVar4 >> 0x12;
  uVar5 = uVar5 + (uVar4 & uVar2 | uVar3 & (uVar2 ^ 0xffffffff)) + local_5c + -0x70e44324;
  uVar5 = uVar5 * 0x20 | uVar5 >> 0x1b;
  uVar2 = uVar2 + (uVar5 & uVar3 | uVar4 & (uVar3 ^ 0xffffffff)) + local_3c + -0x70e44324;
  uVar6 = uVar2 * 0x40 | uVar2 >> 0x1a;
  uVar3 = uVar3 + (uVar6 & uVar4 | uVar5 & (uVar4 ^ 0xffffffff)) + __ROLc_tmp_121 + -0x70e44324;
  uVar2 = uVar3 * 0x100 | uVar3 >> 0x18;
  uVar4 = uVar4 + (uVar2 & uVar5 | uVar6 & (uVar5 ^ 0xffffffff)) + local_64 + -0x70e44324;
  uVar3 = uVar4 * 0x40 | uVar4 >> 0x1a;
  uVar5 = uVar5 + (uVar3 & uVar6 | uVar2 & (uVar6 ^ 0xffffffff)) + __ROLc_tmp_125 + -0x70e44324;
  uVar4 = uVar5 * 0x20 | uVar5 >> 0x1b;
  uVar6 = uVar6 + (uVar4 & uVar2 | uVar3 & (uVar2 ^ 0xffffffff)) + __ROLc_tmp_127 + -0x70e44324;
  uVar5 = *(int *)(in_RDI + 0x4c) +
          (uVar9 & uVar7 | uVar8 & (uVar7 ^ 0xffffffff)) + local_64 + 0x50a28be6;
  uVar5 = uVar5 * 0x100 | uVar5 >> 0x18;
  uVar7 = uVar7 + (uVar5 & uVar8 | uVar9 & (uVar8 ^ 0xffffffff)) + __ROLc_tmp_121 + 0x50a28be6;
  uVar7 = uVar7 * 0x200 | uVar7 >> 0x17;
  uVar8 = uVar8 + (uVar7 & uVar9 | uVar5 & (uVar9 ^ 0xffffffff)) + local_5c + 0x50a28be6;
  uVar8 = uVar8 * 0x200 | uVar8 >> 0x17;
  uVar9 = uVar9 + (uVar8 & uVar5 | uVar7 & (uVar5 ^ 0xffffffff)) + local_78[0] + 0x50a28be6;
  uVar9 = uVar9 * 0x800 | uVar9 >> 0x15;
  uVar5 = uVar5 + (uVar9 & uVar7 | uVar8 & (uVar7 ^ 0xffffffff)) + local_54 + 0x50a28be6;
  uVar5 = uVar5 * 0x2000 | uVar5 >> 0x13;
  uVar7 = uVar7 + (uVar5 & uVar8 | uVar9 & (uVar8 ^ 0xffffffff)) + __ROLc_tmp_127 + 0x50a28be6;
  uVar7 = uVar7 * 0x8000 | uVar7 >> 0x11;
  uVar8 = uVar8 + (uVar7 & uVar9 | uVar5 & (uVar9 ^ 0xffffffff)) + local_4c + 0x50a28be6;
  uVar8 = uVar8 * 0x8000 | uVar8 >> 0x11;
  uVar9 = uVar9 + (uVar8 & uVar5 | uVar7 & (uVar5 ^ 0xffffffff)) + __ROLc_tmp_126 + 0x50a28be6;
  uVar9 = uVar9 * 0x20 | uVar9 >> 0x1b;
  uVar5 = uVar5 + (uVar9 & uVar7 | uVar8 & (uVar7 ^ 0xffffffff)) + local_44 + 0x50a28be6;
  uVar5 = uVar5 * 0x80 | uVar5 >> 0x19;
  uVar7 = uVar7 + (uVar5 & uVar8 | uVar9 & (uVar8 ^ 0xffffffff)) + __ROLc_tmp_125 + 0x50a28be6;
  uVar7 = uVar7 * 0x80 | uVar7 >> 0x19;
  uVar8 = uVar8 + (uVar7 & uVar9 | uVar5 & (uVar9 ^ 0xffffffff)) + local_3c + 0x50a28be6;
  uVar8 = uVar8 * 0x100 | uVar8 >> 0x18;
  uVar9 = uVar9 + (uVar8 & uVar5 | uVar7 & (uVar5 ^ 0xffffffff)) + __ROLc_tmp_124 + 0x50a28be6;
  uVar9 = uVar9 * 0x800 | uVar9 >> 0x15;
  uVar5 = uVar5 + (uVar9 & uVar7 | uVar8 & (uVar7 ^ 0xffffffff)) + local_78[1] + 0x50a28be6;
  uVar5 = uVar5 * 0x4000 | uVar5 >> 0x12;
  uVar7 = uVar7 + (uVar5 & uVar8 | uVar9 & (uVar8 ^ 0xffffffff)) + __ROLc_tmp_123 + 0x50a28be6;
  uVar7 = uVar7 * 0x4000 | uVar7 >> 0x12;
  uVar8 = uVar8 + (uVar7 & uVar9 | uVar5 & (uVar9 ^ 0xffffffff)) + local_6c + 0x50a28be6;
  uVar8 = uVar8 * 0x1000 | uVar8 >> 0x14;
  uVar9 = uVar9 + (uVar8 & uVar5 | uVar7 & (uVar5 ^ 0xffffffff)) + __ROLc_tmp_122 + 0x50a28be6;
  uVar9 = uVar9 * 0x40 | uVar9 >> 0x1a;
  uVar5 = uVar5 + ((uVar9 | uVar8 ^ 0xffffffff) ^ uVar7) + __ROLc_tmp_125 + 0x5c4dd124;
  uVar5 = uVar5 * 0x200 | uVar5 >> 0x17;
  uVar7 = uVar7 + ((uVar5 | uVar9 ^ 0xffffffff) ^ uVar8) + local_4c + 0x5c4dd124;
  uVar7 = uVar7 * 0x2000 | uVar7 >> 0x13;
  uVar8 = uVar8 + ((uVar7 | uVar5 ^ 0xffffffff) ^ uVar9) + local_6c + 0x5c4dd124;
  uVar8 = uVar8 * 0x8000 | uVar8 >> 0x11;
  uVar9 = uVar9 + ((uVar8 | uVar7 ^ 0xffffffff) ^ uVar5) + local_5c + 0x5c4dd124;
  uVar9 = uVar9 * 0x80 | uVar9 >> 0x19;
  uVar5 = uVar5 + ((uVar9 | uVar8 ^ 0xffffffff) ^ uVar7) + local_78[0] + 0x5c4dd124;
  uVar5 = uVar5 * 0x1000 | uVar5 >> 0x14;
  uVar7 = uVar7 + ((uVar5 | uVar9 ^ 0xffffffff) ^ uVar8) + local_44 + 0x5c4dd124;
  uVar7 = uVar7 * 0x100 | uVar7 >> 0x18;
  uVar8 = uVar8 + ((uVar7 | uVar5 ^ 0xffffffff) ^ uVar9) + local_64 + 0x5c4dd124;
  uVar8 = uVar8 * 0x200 | uVar8 >> 0x17;
  uVar9 = uVar9 + ((uVar8 | uVar7 ^ 0xffffffff) ^ uVar5) + __ROLc_tmp_123 + 0x5c4dd124;
  uVar9 = uVar9 * 0x800 | uVar9 >> 0x15;
  uVar5 = uVar5 + ((uVar9 | uVar8 ^ 0xffffffff) ^ uVar7) + __ROLc_tmp_121 + 0x5c4dd124;
  uVar5 = uVar5 * 0x80 | uVar5 >> 0x19;
  uVar7 = uVar7 + ((uVar5 | uVar9 ^ 0xffffffff) ^ uVar8) + local_3c + 0x5c4dd124;
  uVar7 = uVar7 * 0x80 | uVar7 >> 0x19;
  uVar8 = uVar8 + ((uVar7 | uVar5 ^ 0xffffffff) ^ uVar9) + __ROLc_tmp_124 + 0x5c4dd124;
  uVar8 = uVar8 * 0x1000 | uVar8 >> 0x14;
  uVar9 = uVar9 + ((uVar8 | uVar7 ^ 0xffffffff) ^ uVar5) + __ROLc_tmp_122 + 0x5c4dd124;
  uVar9 = uVar9 * 0x80 | uVar9 >> 0x19;
  uVar5 = uVar5 + ((uVar9 | uVar8 ^ 0xffffffff) ^ uVar7) + __ROLc_tmp_126 + 0x5c4dd124;
  uVar5 = uVar5 * 0x40 | uVar5 >> 0x1a;
  uVar7 = uVar7 + ((uVar5 | uVar9 ^ 0xffffffff) ^ uVar8) + local_54 + 0x5c4dd124;
  uVar7 = uVar7 * 0x8000 | uVar7 >> 0x11;
  uVar8 = uVar8 + ((uVar7 | uVar5 ^ 0xffffffff) ^ uVar9) + local_78[1] + 0x5c4dd124;
  uVar8 = uVar8 * 0x2000 | uVar8 >> 0x13;
  uVar9 = uVar9 + ((uVar8 | uVar7 ^ 0xffffffff) ^ uVar5) + __ROLc_tmp_127 + 0x5c4dd124;
  uVar9 = uVar9 * 0x800 | uVar9 >> 0x15;
  uVar5 = uVar5 + (uVar9 & uVar8 | (uVar9 ^ 0xffffffff) & uVar7) + local_3c + 0x6d703ef3;
  uVar5 = uVar5 * 0x200 | uVar5 >> 0x17;
  uVar7 = uVar7 + (uVar5 & uVar9 | (uVar5 ^ 0xffffffff) & uVar8) + local_64 + 0x6d703ef3;
  uVar7 = uVar7 * 0x80 | uVar7 >> 0x19;
  uVar8 = uVar8 + (uVar7 & uVar5 | (uVar7 ^ 0xffffffff) & uVar9) + local_78[1] + 0x6d703ef3;
  uVar8 = uVar8 * 0x8000 | uVar8 >> 0x11;
  uVar9 = uVar9 + (uVar8 & uVar7 | (uVar8 ^ 0xffffffff) & uVar5) + local_6c + 0x6d703ef3;
  uVar9 = uVar9 * 0x800 | uVar9 >> 0x15;
  uVar5 = uVar5 + (uVar9 & uVar8 | (uVar9 ^ 0xffffffff) & uVar7) + local_5c + 0x6d703ef3;
  uVar5 = uVar5 * 0x100 | uVar5 >> 0x18;
  uVar7 = uVar7 + (uVar5 & uVar9 | (uVar5 ^ 0xffffffff) & uVar8) + __ROLc_tmp_121 + 0x6d703ef3;
  uVar7 = uVar7 * 0x40 | uVar7 >> 0x1a;
  uVar8 = uVar8 + (uVar7 & uVar5 | (uVar7 ^ 0xffffffff) & uVar9) + __ROLc_tmp_125 + 0x6d703ef3;
  uVar8 = uVar8 * 0x40 | uVar8 >> 0x1a;
  uVar9 = uVar9 + (uVar8 & uVar7 | (uVar8 ^ 0xffffffff) & uVar5) + local_54 + 0x6d703ef3;
  uVar9 = uVar9 * 0x4000 | uVar9 >> 0x12;
  uVar5 = uVar5 + (uVar9 & uVar8 | (uVar9 ^ 0xffffffff) & uVar7) + local_4c + 0x6d703ef3;
  uVar5 = uVar5 * 0x1000 | uVar5 >> 0x14;
  uVar7 = uVar7 + (uVar5 & uVar9 | (uVar5 ^ 0xffffffff) & uVar8) + __ROLc_tmp_124 + 0x6d703ef3;
  uVar7 = uVar7 * 0x2000 | uVar7 >> 0x13;
  uVar8 = uVar8 + (uVar7 & uVar5 | (uVar7 ^ 0xffffffff) & uVar9) + __ROLc_tmp_122 + 0x6d703ef3;
  uVar8 = uVar8 * 0x20 | uVar8 >> 0x1b;
  uVar9 = uVar9 + (uVar8 & uVar7 | (uVar8 ^ 0xffffffff) & uVar5) + __ROLc_tmp_127 + 0x6d703ef3;
  uVar9 = uVar9 * 0x4000 | uVar9 >> 0x12;
  uVar5 = uVar5 + (uVar9 & uVar8 | (uVar9 ^ 0xffffffff) & uVar7) + __ROLc_tmp_123 + 0x6d703ef3;
  uVar5 = uVar5 * 0x2000 | uVar5 >> 0x13;
  uVar7 = uVar7 + (uVar5 & uVar9 | (uVar5 ^ 0xffffffff) & uVar8) + local_78[0] + 0x6d703ef3;
  uVar7 = uVar7 * 0x2000 | uVar7 >> 0x13;
  uVar8 = uVar8 + (uVar7 & uVar5 | (uVar7 ^ 0xffffffff) & uVar9) + __ROLc_tmp_126 + 0x6d703ef3;
  uVar8 = uVar8 * 0x80 | uVar8 >> 0x19;
  uVar9 = uVar9 + (uVar8 & uVar7 | (uVar8 ^ 0xffffffff) & uVar5) + local_44 + 0x6d703ef3;
  uVar9 = uVar9 * 0x20 | uVar9 >> 0x1b;
  uVar5 = (uVar9 ^ uVar8 ^ uVar7) + __ROLc_tmp_124 + uVar5;
  uVar5 = uVar5 * 0x8000 | uVar5 >> 0x11;
  uVar7 = (uVar5 ^ uVar9 ^ uVar8) + __ROLc_tmp_125 + uVar7;
  uVar7 = uVar7 * 0x20 | uVar7 >> 0x1b;
  uVar8 = (uVar7 ^ uVar5 ^ uVar9) + __ROLc_tmp_126 + uVar8;
  uVar8 = uVar8 * 0x100 | uVar8 >> 0x18;
  uVar9 = (uVar8 ^ uVar7 ^ uVar5) + local_78[1] + uVar9;
  uVar9 = uVar9 * 0x800 | uVar9 >> 0x15;
  uVar5 = (uVar9 ^ uVar8 ^ uVar7) + local_6c + uVar5;
  uVar5 = uVar5 * 0x4000 | uVar5 >> 0x12;
  uVar7 = (uVar5 ^ uVar9 ^ uVar8) + local_4c + uVar7;
  uVar7 = uVar7 * 0x4000 | uVar7 >> 0x12;
  uVar8 = (uVar7 ^ uVar5 ^ uVar9) + local_3c + uVar8;
  uVar8 = uVar8 * 0x40 | uVar8 >> 0x1a;
  uVar9 = (uVar8 ^ uVar7 ^ uVar5) + local_78[0] + uVar9;
  uVar9 = uVar9 * 0x4000 | uVar9 >> 0x12;
  uVar5 = (uVar9 ^ uVar8 ^ uVar7) + local_64 + uVar5;
  uVar5 = uVar5 * 0x40 | uVar5 >> 0x1a;
  uVar7 = (uVar5 ^ uVar9 ^ uVar8) + __ROLc_tmp_122 + uVar7;
  uVar7 = uVar7 * 0x200 | uVar7 >> 0x17;
  uVar8 = (uVar7 ^ uVar5 ^ uVar9) + __ROLc_tmp_127 + uVar8;
  uVar10 = uVar8 * 0x1000 | uVar8 >> 0x14;
  uVar9 = (uVar10 ^ uVar7 ^ uVar5) + local_44 + uVar9;
  uVar11 = uVar9 * 0x200 | uVar9 >> 0x17;
  uVar5 = (uVar11 ^ uVar10 ^ uVar7) + local_54 + uVar5;
  uVar9 = uVar5 * 0x1000 | uVar5 >> 0x14;
  uVar7 = (uVar9 ^ uVar11 ^ uVar10) + local_5c + uVar7;
  uVar8 = uVar7 * 0x20 | uVar7 >> 0x1b;
  uVar10 = (uVar8 ^ uVar9 ^ uVar11) + __ROLc_tmp_123 + uVar10;
  uVar7 = uVar10 * 0x8000 | uVar10 >> 0x11;
  uVar11 = (uVar7 ^ uVar8 ^ uVar9) + __ROLc_tmp_121 + uVar11;
  iVar1 = *(int *)(in_RDI + 0x50);
  *(uint *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x54) + uVar3 + uVar9;
  *(uint *)(in_RDI + 0x54) = *(int *)(in_RDI + 0x58) + uVar2 + (uVar11 * 0x100 | uVar11 >> 0x18);
  *(uint *)(in_RDI + 0x58) = *(int *)(in_RDI + 0x4c) + (uVar6 * 0x1000 | uVar6 >> 0x14) + uVar7;
  *(uint *)(in_RDI + 0x4c) = uVar4 + iVar1 + uVar8;
  return 0;
}

Assistant:

static int  rmd128_compress(hash_state *md, unsigned char *buf)
#endif
{
   ulong32 aa,bb,cc,dd,aaa,bbb,ccc,ddd,X[16];
   int i;

   /* load words X */
   for (i = 0; i < 16; i++){
      LOAD32L(X[i], buf + (4 * i));
   }

   /* load state */
   aa = aaa = md->rmd128.state[0];
   bb = bbb = md->rmd128.state[1];
   cc = ccc = md->rmd128.state[2];
   dd = ddd = md->rmd128.state[3];

   /* round 1 */
   FF(aa, bb, cc, dd, X[ 0], 11);
   FF(dd, aa, bb, cc, X[ 1], 14);
   FF(cc, dd, aa, bb, X[ 2], 15);
   FF(bb, cc, dd, aa, X[ 3], 12);
   FF(aa, bb, cc, dd, X[ 4],  5);
   FF(dd, aa, bb, cc, X[ 5],  8);
   FF(cc, dd, aa, bb, X[ 6],  7);
   FF(bb, cc, dd, aa, X[ 7],  9);
   FF(aa, bb, cc, dd, X[ 8], 11);
   FF(dd, aa, bb, cc, X[ 9], 13);
   FF(cc, dd, aa, bb, X[10], 14);
   FF(bb, cc, dd, aa, X[11], 15);
   FF(aa, bb, cc, dd, X[12],  6);
   FF(dd, aa, bb, cc, X[13],  7);
   FF(cc, dd, aa, bb, X[14],  9);
   FF(bb, cc, dd, aa, X[15],  8);

   /* round 2 */
   GG(aa, bb, cc, dd, X[ 7],  7);
   GG(dd, aa, bb, cc, X[ 4],  6);
   GG(cc, dd, aa, bb, X[13],  8);
   GG(bb, cc, dd, aa, X[ 1], 13);
   GG(aa, bb, cc, dd, X[10], 11);
   GG(dd, aa, bb, cc, X[ 6],  9);
   GG(cc, dd, aa, bb, X[15],  7);
   GG(bb, cc, dd, aa, X[ 3], 15);
   GG(aa, bb, cc, dd, X[12],  7);
   GG(dd, aa, bb, cc, X[ 0], 12);
   GG(cc, dd, aa, bb, X[ 9], 15);
   GG(bb, cc, dd, aa, X[ 5],  9);
   GG(aa, bb, cc, dd, X[ 2], 11);
   GG(dd, aa, bb, cc, X[14],  7);
   GG(cc, dd, aa, bb, X[11], 13);
   GG(bb, cc, dd, aa, X[ 8], 12);

   /* round 3 */
   HH(aa, bb, cc, dd, X[ 3], 11);
   HH(dd, aa, bb, cc, X[10], 13);
   HH(cc, dd, aa, bb, X[14],  6);
   HH(bb, cc, dd, aa, X[ 4],  7);
   HH(aa, bb, cc, dd, X[ 9], 14);
   HH(dd, aa, bb, cc, X[15],  9);
   HH(cc, dd, aa, bb, X[ 8], 13);
   HH(bb, cc, dd, aa, X[ 1], 15);
   HH(aa, bb, cc, dd, X[ 2], 14);
   HH(dd, aa, bb, cc, X[ 7],  8);
   HH(cc, dd, aa, bb, X[ 0], 13);
   HH(bb, cc, dd, aa, X[ 6],  6);
   HH(aa, bb, cc, dd, X[13],  5);
   HH(dd, aa, bb, cc, X[11], 12);
   HH(cc, dd, aa, bb, X[ 5],  7);
   HH(bb, cc, dd, aa, X[12],  5);

   /* round 4 */
   II(aa, bb, cc, dd, X[ 1], 11);
   II(dd, aa, bb, cc, X[ 9], 12);
   II(cc, dd, aa, bb, X[11], 14);
   II(bb, cc, dd, aa, X[10], 15);
   II(aa, bb, cc, dd, X[ 0], 14);
   II(dd, aa, bb, cc, X[ 8], 15);
   II(cc, dd, aa, bb, X[12],  9);
   II(bb, cc, dd, aa, X[ 4],  8);
   II(aa, bb, cc, dd, X[13],  9);
   II(dd, aa, bb, cc, X[ 3], 14);
   II(cc, dd, aa, bb, X[ 7],  5);
   II(bb, cc, dd, aa, X[15],  6);
   II(aa, bb, cc, dd, X[14],  8);
   II(dd, aa, bb, cc, X[ 5],  6);
   II(cc, dd, aa, bb, X[ 6],  5);
   II(bb, cc, dd, aa, X[ 2], 12);

   /* parallel round 1 */
   III(aaa, bbb, ccc, ddd, X[ 5],  8);
   III(ddd, aaa, bbb, ccc, X[14],  9);
   III(ccc, ddd, aaa, bbb, X[ 7],  9);
   III(bbb, ccc, ddd, aaa, X[ 0], 11);
   III(aaa, bbb, ccc, ddd, X[ 9], 13);
   III(ddd, aaa, bbb, ccc, X[ 2], 15);
   III(ccc, ddd, aaa, bbb, X[11], 15);
   III(bbb, ccc, ddd, aaa, X[ 4],  5);
   III(aaa, bbb, ccc, ddd, X[13],  7);
   III(ddd, aaa, bbb, ccc, X[ 6],  7);
   III(ccc, ddd, aaa, bbb, X[15],  8);
   III(bbb, ccc, ddd, aaa, X[ 8], 11);
   III(aaa, bbb, ccc, ddd, X[ 1], 14);
   III(ddd, aaa, bbb, ccc, X[10], 14);
   III(ccc, ddd, aaa, bbb, X[ 3], 12);
   III(bbb, ccc, ddd, aaa, X[12],  6);

   /* parallel round 2 */
   HHH(aaa, bbb, ccc, ddd, X[ 6],  9);
   HHH(ddd, aaa, bbb, ccc, X[11], 13);
   HHH(ccc, ddd, aaa, bbb, X[ 3], 15);
   HHH(bbb, ccc, ddd, aaa, X[ 7],  7);
   HHH(aaa, bbb, ccc, ddd, X[ 0], 12);
   HHH(ddd, aaa, bbb, ccc, X[13],  8);
   HHH(ccc, ddd, aaa, bbb, X[ 5],  9);
   HHH(bbb, ccc, ddd, aaa, X[10], 11);
   HHH(aaa, bbb, ccc, ddd, X[14],  7);
   HHH(ddd, aaa, bbb, ccc, X[15],  7);
   HHH(ccc, ddd, aaa, bbb, X[ 8], 12);
   HHH(bbb, ccc, ddd, aaa, X[12],  7);
   HHH(aaa, bbb, ccc, ddd, X[ 4],  6);
   HHH(ddd, aaa, bbb, ccc, X[ 9], 15);
   HHH(ccc, ddd, aaa, bbb, X[ 1], 13);
   HHH(bbb, ccc, ddd, aaa, X[ 2], 11);

   /* parallel round 3 */
   GGG(aaa, bbb, ccc, ddd, X[15],  9);
   GGG(ddd, aaa, bbb, ccc, X[ 5],  7);
   GGG(ccc, ddd, aaa, bbb, X[ 1], 15);
   GGG(bbb, ccc, ddd, aaa, X[ 3], 11);
   GGG(aaa, bbb, ccc, ddd, X[ 7],  8);
   GGG(ddd, aaa, bbb, ccc, X[14],  6);
   GGG(ccc, ddd, aaa, bbb, X[ 6],  6);
   GGG(bbb, ccc, ddd, aaa, X[ 9], 14);
   GGG(aaa, bbb, ccc, ddd, X[11], 12);
   GGG(ddd, aaa, bbb, ccc, X[ 8], 13);
   GGG(ccc, ddd, aaa, bbb, X[12],  5);
   GGG(bbb, ccc, ddd, aaa, X[ 2], 14);
   GGG(aaa, bbb, ccc, ddd, X[10], 13);
   GGG(ddd, aaa, bbb, ccc, X[ 0], 13);
   GGG(ccc, ddd, aaa, bbb, X[ 4],  7);
   GGG(bbb, ccc, ddd, aaa, X[13],  5);

   /* parallel round 4 */
   FFF(aaa, bbb, ccc, ddd, X[ 8], 15);
   FFF(ddd, aaa, bbb, ccc, X[ 6],  5);
   FFF(ccc, ddd, aaa, bbb, X[ 4],  8);
   FFF(bbb, ccc, ddd, aaa, X[ 1], 11);
   FFF(aaa, bbb, ccc, ddd, X[ 3], 14);
   FFF(ddd, aaa, bbb, ccc, X[11], 14);
   FFF(ccc, ddd, aaa, bbb, X[15],  6);
   FFF(bbb, ccc, ddd, aaa, X[ 0], 14);
   FFF(aaa, bbb, ccc, ddd, X[ 5],  6);
   FFF(ddd, aaa, bbb, ccc, X[12],  9);
   FFF(ccc, ddd, aaa, bbb, X[ 2], 12);
   FFF(bbb, ccc, ddd, aaa, X[13],  9);
   FFF(aaa, bbb, ccc, ddd, X[ 9], 12);
   FFF(ddd, aaa, bbb, ccc, X[ 7],  5);
   FFF(ccc, ddd, aaa, bbb, X[10], 15);
   FFF(bbb, ccc, ddd, aaa, X[14],  8);

   /* combine results */
   ddd += cc + md->rmd128.state[1];               /* final result for MDbuf[0] */
   md->rmd128.state[1] = md->rmd128.state[2] + dd + aaa;
   md->rmd128.state[2] = md->rmd128.state[3] + aa + bbb;
   md->rmd128.state[3] = md->rmd128.state[0] + bb + ccc;
   md->rmd128.state[0] = ddd;

   return CRYPT_OK;
}